

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O2

bool __thiscall
ArmParser::parsePseudoShift(ArmParser *this,Parser *parser,ArmOpcodeVariables *vars,int type)

{
  bool bVar1;
  bool bVar2;
  Token *pTVar3;
  
  (vars->Shift).Type = (uchar)type;
  bVar1 = parseRegister(this,parser,&(vars->Shift).reg,0xf);
  bVar2 = true;
  if (!bVar1) {
    pTVar3 = Parser::peekToken(parser,0);
    if (pTVar3->type == Hash) {
      Parser::eatToken(parser);
    }
    bVar1 = parseImmediate(this,parser,&(vars->Shift).ShiftExpression);
    bVar2 = false;
    if (!bVar1) {
      return false;
    }
  }
  (vars->Shift).ShiftByRegister = bVar2;
  (vars->Shift).UseShift = true;
  return true;
}

Assistant:

bool ArmParser::parsePseudoShift(Parser& parser, ArmOpcodeVariables& vars, int type)
{
	vars.Shift.Type = type;

	if (parseRegister(parser,vars.Shift.reg))
	{
		vars.Shift.ShiftByRegister = true;
	} else {
		if (parser.peekToken().type == TokenType::Hash)
			parser.eatToken();
		
		if (!parseImmediate(parser,vars.Shift.ShiftExpression))
			return false;

		vars.Shift.ShiftByRegister = false;
	}
	
	vars.Shift.UseShift = true;
	return true;
}